

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int cvQuadSensEwtSet(CVodeMem cv_mem,N_Vector *yQScur,N_Vector *weightQS)

{
  N_Vector qcur;
  int iVar1;
  long lVar2;
  double dVar3;
  
  iVar1 = cv_mem->cv_itolQS;
  if (iVar1 == 1) {
    if (cv_mem->cv_Ns < 1) {
      return 0;
    }
    lVar2 = 0;
    do {
      N_VAbs(yQScur[lVar2],cv_mem->cv_tempvQ);
      N_VScale(cv_mem->cv_reltolQS,cv_mem->cv_tempvQ,cv_mem->cv_tempvQ);
      N_VAddConst(cv_mem->cv_SabstolQS[lVar2],cv_mem->cv_tempvQ,cv_mem->cv_tempvQ);
      if ((cv_mem->cv_atolQSmin0[lVar2] != 0) &&
         (dVar3 = (double)N_VMin(cv_mem->cv_tempvQ), dVar3 <= 0.0)) {
        return -1;
      }
      N_VInv(cv_mem->cv_tempvQ,weightQS[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < cv_mem->cv_Ns);
  }
  else if (iVar1 == 2) {
    if (cv_mem->cv_Ns < 1) {
      return 0;
    }
    lVar2 = 0;
    do {
      N_VAbs(yQScur[lVar2],cv_mem->cv_tempvQ);
      N_VLinearSum(cv_mem->cv_reltolQS,cv_mem->cv_tempvQ,cv_mem->cv_VabstolQS[lVar2],
                   cv_mem->cv_tempvQ);
      if ((cv_mem->cv_atolQSmin0[lVar2] != 0) &&
         (dVar3 = (double)N_VMin(cv_mem->cv_tempvQ), dVar3 <= 0.0)) {
        return -1;
      }
      N_VInv(cv_mem->cv_tempvQ,weightQS[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < cv_mem->cv_Ns);
  }
  else {
    if (iVar1 != 4) {
      return 0;
    }
    if (cv_mem->cv_Ns < 1) {
      return 0;
    }
    qcur = *cv_mem->cv_tempvQS;
    lVar2 = 0;
    do {
      N_VScale(cv_mem->cv_pbar[lVar2],yQScur[lVar2],qcur);
      iVar1 = cvQuadEwtSet(cv_mem,qcur,weightQS[lVar2]);
      if (iVar1 != 0) {
        return -1;
      }
      N_VScale(cv_mem->cv_pbar[lVar2],weightQS[lVar2],weightQS[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < cv_mem->cv_Ns);
  }
  return 0;
}

Assistant:

static int cvQuadSensEwtSet(CVodeMem cv_mem, N_Vector* yQScur, N_Vector* weightQS)
{
  int flag = 0;

  switch (cv_mem->cv_itolQS)
  {
  case CV_EE: flag = cvQuadSensEwtSetEE(cv_mem, yQScur, weightQS); break;
  case CV_SS: flag = cvQuadSensEwtSetSS(cv_mem, yQScur, weightQS); break;
  case CV_SV: flag = cvQuadSensEwtSetSV(cv_mem, yQScur, weightQS); break;
  }

  return (flag);
}